

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int local_4c;
  int local_48;
  int p;
  int v;
  char local_31;
  undefined1 local_30 [7];
  char c;
  queue<int> q;
  
  q.mFront._4_4_ = 0;
  CP::queue<int>::queue((queue<int> *)local_30);
  __isoc99_scanf("%c",&local_31);
  while (local_31 != 'q') {
    if (local_31 == 'u') {
      __isoc99_scanf("%d",&local_48);
      CP::queue<int>::push((queue<int> *)local_30,&local_48);
    }
    else if (local_31 == 'o') {
      CP::queue<int>::pop((queue<int> *)local_30);
    }
    else if (local_31 == 'p') {
      CP::queue<int>::print((queue<int> *)local_30);
    }
    else if (local_31 == 'm') {
      __isoc99_scanf("%d",&local_4c);
      CP::queue<int>::move_to_front((queue<int> *)local_30,(long)local_4c);
    }
    __isoc99_scanf("%c",&local_31);
  }
  q.mFront._4_4_ = 0;
  CP::queue<int>::~queue((queue<int> *)local_30);
  return q.mFront._4_4_;
}

Assistant:

int main() {
  CP::queue<int> q;
  char c;
  scanf("%c", &c);
  while (c != 'q') {
    if (c == 'u') {
      // add data
      int v;
      scanf("%d", &v);
      q.push(v);
    } else if (c == 'o') {
      q.pop();
    } else if (c == 'p') {
      q.print();
    } else if (c == 'm') {
      int p;
      scanf("%d", &p);
      q.move_to_front(p);
    }
    scanf("%c", &c);
  }
  return 0;
}